

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  ulong *puVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  undefined1 *puVar20;
  PreparedDictionary *pPVar21;
  byte bVar22;
  short sVar23;
  long lVar24;
  uint8_t *s1_orig_1;
  PreparedDictionary *pPVar25;
  PreparedDictionary *pPVar26;
  PreparedDictionary *pPVar27;
  ulong *puVar28;
  char *pcVar29;
  char cVar30;
  ulong *puVar31;
  ulong uVar32;
  int iVar33;
  PreparedDictionary *pPVar34;
  PreparedDictionary *pPVar35;
  long lVar36;
  PreparedDictionary *pPVar37;
  PreparedDictionary *pPVar38;
  bool bVar39;
  PreparedDictionary *local_138;
  PreparedDictionary *local_130;
  PreparedDictionary *local_118;
  ulong local_108;
  ulong local_100;
  long local_d0;
  size_t *local_c8;
  PreparedDictionary *local_c0;
  ulong local_a8 [2];
  PreparedDictionary *local_98;
  undefined1 *local_90;
  ulong local_88;
  ContextLut local_80;
  PreparedDictionary *local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  PreparedDictionary *local_50;
  PreparedDictionary *local_48;
  PreparedDictionary *local_40;
  PreparedDictionary *local_38;
  
  local_138 = *(PreparedDictionary **)dist_cache;
  local_90 = (undefined1 *)(position + num_bytes);
  local_48 = (PreparedDictionary *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    local_48 = (PreparedDictionary *)position;
  }
  local_50 = (PreparedDictionary *)0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_50 = (PreparedDictionary *)0x40;
  }
  if ((undefined1 *)(position + 8) < local_90) {
    pPVar34 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
    local_58 = *(long *)(literal_context_lut + 0x10);
    local_80 = literal_context_lut;
    local_60 = *(long *)(literal_context_lut + 0x60);
    pPVar38 = (PreparedDictionary *)((long)&local_50->magic + position);
    sVar6 = (params->dictionary).compound.num_chunks;
    local_88 = ringbuffer_mask & 0xffffffff;
    local_70 = (ulong)(uint)((int)local_50 * 4);
    local_98 = (PreparedDictionary *)(local_90 + -7);
    local_68 = (position - 1) + num_bytes;
    local_c8 = last_insert_len;
    puVar20 = local_90;
    pPVar25 = (PreparedDictionary *)position;
    pPVar21 = (PreparedDictionary *)position;
    do {
      local_130 = (PreparedDictionary *)(puVar20 + -(long)pPVar21);
      pPVar26 = pPVar34;
      if (pPVar21 < pPVar34) {
        pPVar26 = pPVar21;
      }
      uVar32 = (ulong)pPVar21 & ringbuffer_mask;
      puVar2 = (ulong *)(ringbuffer + uVar32);
      bVar22 = ringbuffer[uVar32];
      local_c0 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      local_100 = 0x7e4;
      local_88._0_4_ = (uint)ringbuffer_mask;
      if (((PreparedDictionary *)((long)pPVar21 - (long)local_c0) < pPVar21) &&
         (uVar11 = (uint)(PreparedDictionary *)((long)pPVar21 - (long)local_c0) & (uint)local_88,
         bVar22 == ringbuffer[uVar11])) {
        puVar16 = (ulong *)(ringbuffer + uVar11);
        puVar18 = puVar2;
        puVar28 = puVar16;
        for (pPVar37 = local_130; (PreparedDictionary *)0x7 < pPVar37;
            pPVar37 = (PreparedDictionary *)&pPVar37[-1].bucket_bits) {
          uVar17 = *puVar18;
          uVar7 = *puVar28;
          if (uVar17 == uVar7) {
            puVar28 = puVar28 + 1;
          }
          else {
            uVar8 = 0;
            if ((uVar7 ^ uVar17) != 0) {
              for (; ((uVar7 ^ uVar17) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pPVar25 = (PreparedDictionary *)
                      ((long)puVar28 + ((uVar8 >> 3 & 0x1fffffff) - (long)puVar16));
          }
          local_38 = pPVar25;
          if (uVar17 != uVar7) goto LAB_01d4c99e;
          puVar18 = puVar18 + 1;
        }
        puVar31 = puVar28;
        if (pPVar37 != (PreparedDictionary *)0x0) {
          puVar31 = (ulong *)((long)puVar28 + (long)pPVar37);
          pPVar25 = (PreparedDictionary *)0x0;
          do {
            if (*(char *)((long)puVar28 + (long)pPVar25) != *(char *)((long)puVar18 + (long)pPVar25)
               ) {
              puVar31 = (ulong *)((long)puVar28 + (long)pPVar25);
              break;
            }
            pPVar25 = (PreparedDictionary *)((long)&pPVar25->magic + 1);
          } while (pPVar37 != pPVar25);
        }
        local_38 = (PreparedDictionary *)((long)puVar31 - (long)puVar16);
LAB_01d4c99e:
        if ((local_38 < (PreparedDictionary *)0x4) ||
           (uVar17 = (long)local_38 * 0x87 + 0x78f, uVar17 < 0x7e5)) goto LAB_01d4c9cc;
        bVar22 = *(byte *)((long)puVar2 + (long)local_38);
        local_100 = uVar17;
      }
      else {
LAB_01d4c9cc:
        local_c0 = (PreparedDictionary *)0x0;
        local_38 = (PreparedDictionary *)0x0;
      }
      uVar11 = (uint)(ushort)((ulong)(*(long *)(ringbuffer + uVar32) * 0x7bd3579bd3000000) >> 0x30);
      local_a8[0] = (ulong)uVar11;
      local_a8[1] = (ulong)uVar11 + 8 & 0xffff;
      uVar11 = (uint)pPVar21;
      lVar24 = 0;
      do {
        uVar14 = *(uint *)(sVar6 + local_a8[lVar24] * 4);
        puVar18 = (ulong *)(ringbuffer + ((uint)local_88 & uVar14));
        bVar3 = *(byte *)((long)&local_38->magic + (long)puVar18);
        pPVar37 = (PreparedDictionary *)(ulong)bVar3;
        if (((bVar22 == bVar3) && (pPVar21 != (PreparedDictionary *)(ulong)uVar14)) &&
           (pPVar35 = (PreparedDictionary *)((long)pPVar21 - (long)(ulong)uVar14),
           pPVar27 = local_130, puVar28 = puVar2, puVar16 = puVar18, pPVar35 <= pPVar26)) {
          for (; (PreparedDictionary *)0x7 < pPVar27;
              pPVar27 = (PreparedDictionary *)&pPVar27[-1].bucket_bits) {
            uVar32 = *puVar28;
            uVar17 = *puVar16;
            if (uVar32 == uVar17) {
              puVar16 = puVar16 + 1;
            }
            else {
              uVar7 = 0;
              if ((uVar17 ^ uVar32) != 0) {
                for (; ((uVar17 ^ uVar32) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              pPVar25 = (PreparedDictionary *)((long)puVar16 - (long)puVar18);
              pPVar37 = (PreparedDictionary *)((long)&pPVar25->magic + (uVar7 >> 3 & 0x1fffffff));
            }
            if (uVar32 != uVar17) goto LAB_01d4caef;
            puVar28 = puVar28 + 1;
          }
          puVar31 = puVar16;
          if (pPVar27 != (PreparedDictionary *)0x0) {
            puVar31 = (ulong *)((long)puVar16 + (long)pPVar27);
            pPVar37 = (PreparedDictionary *)0x0;
            do {
              pPVar25 = (PreparedDictionary *)
                        CONCAT71((int7)((ulong)pPVar25 >> 8),
                                 *(char *)((long)puVar16 + (long)pPVar37));
              if (*(char *)((long)puVar16 + (long)pPVar37) !=
                  *(char *)((long)puVar28 + (long)pPVar37)) {
                puVar31 = (ulong *)((long)puVar16 + (long)pPVar37);
                break;
              }
              pPVar37 = (PreparedDictionary *)((long)&pPVar37->magic + 1);
            } while (pPVar27 != pPVar37);
          }
          pPVar37 = (PreparedDictionary *)((long)puVar31 - (long)puVar18);
LAB_01d4caef:
          if ((PreparedDictionary *)0x3 < pPVar37) {
            iVar15 = 0x1f;
            if ((uint)pPVar35 != 0) {
              for (; (uint)pPVar35 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            uVar32 = (ulong)(iVar15 * -0x1e + 0x780) + (long)pPVar37 * 0x87;
            if (local_100 < uVar32) {
              bVar22 = *(byte *)((long)puVar2 + (long)pPVar37);
              local_38 = pPVar37;
              local_c0 = pPVar35;
              local_100 = uVar32;
            }
          }
        }
        bVar39 = lVar24 == 0;
        lVar24 = lVar24 + 1;
      } while (bVar39);
      *(uint *)(sVar6 + *(long *)((long)local_a8 + (ulong)(uVar11 & 8)) * 4) = uVar11;
      if ((PreparedDictionary *)0x1f < local_130 && ((ulong)pPVar21 & 3) == 0) {
        pPVar27 = (params->dictionary).compound.chunks[1];
        if (pPVar27 <= pPVar21) {
          uVar14 = (uint)(params->dictionary).compound.total_size;
          uVar13 = *(uint *)((long)(params->dictionary).compound.chunks + 0x14);
          iVar15 = *(int *)((params->dictionary).compound.chunks + 3);
          do {
            uVar12 = uVar14 & 0x3fffffff;
            bVar22 = ringbuffer[(ulong)pPVar27 & ringbuffer_mask];
            bVar3 = ringbuffer[(ulong)&pPVar27[1].source_size & ringbuffer_mask];
            if (uVar12 < 0x1000000) {
              pPVar25 = (params->dictionary).compound.chunks[0];
              uVar4 = (&pPVar25->magic)[uVar12];
              (&pPVar25->magic)[uVar12] = (uint32_t)pPVar27;
              if ((pPVar27 == pPVar21) && (uVar4 != 0xffffffff)) {
                uVar12 = uVar11 - uVar4;
                if ((PreparedDictionary *)(ulong)uVar12 <= pPVar26) {
                  puVar16 = (ulong *)(ringbuffer + (uVar4 & (uint)local_88));
                  puVar18 = puVar2;
                  puVar28 = puVar16;
                  for (pPVar25 = local_130; (PreparedDictionary *)0x7 < pPVar25;
                      pPVar25 = (PreparedDictionary *)&pPVar25[-1].bucket_bits) {
                    uVar32 = *puVar18;
                    uVar17 = *puVar28;
                    if (uVar32 == uVar17) {
                      puVar28 = puVar28 + 1;
                    }
                    else {
                      uVar7 = 0;
                      if ((uVar17 ^ uVar32) != 0) {
                        for (; ((uVar17 ^ uVar32) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                        }
                      }
                      pPVar37 = (PreparedDictionary *)
                                ((long)puVar28 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar16));
                    }
                    if (uVar32 != uVar17) goto LAB_01d4ccae;
                    puVar18 = puVar18 + 1;
                  }
                  puVar31 = puVar28;
                  if (pPVar25 != (PreparedDictionary *)0x0) {
                    puVar31 = (ulong *)((long)puVar28 + (long)pPVar25);
                    pPVar37 = (PreparedDictionary *)0x0;
                    do {
                      if (*(char *)((long)puVar28 + (long)pPVar37) !=
                          *(char *)((long)puVar18 + (long)pPVar37)) {
                        puVar31 = (ulong *)((long)puVar28 + (long)pPVar37);
                        break;
                      }
                      pPVar37 = (PreparedDictionary *)((long)&pPVar37->magic + 1);
                    } while (pPVar25 != pPVar37);
                  }
                  pPVar37 = (PreparedDictionary *)((long)puVar31 - (long)puVar16);
LAB_01d4ccae:
                  if (((PreparedDictionary *)0x3 < pPVar37) && (local_38 < pPVar37)) {
                    iVar33 = 0x1f;
                    if (uVar12 != 0) {
                      for (; uVar12 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                      }
                    }
                    uVar32 = (ulong)(iVar33 * -0x1e + 0x780) + (long)pPVar37 * 0x87;
                    if (local_100 < uVar32) {
                      local_38 = pPVar37;
                      local_100 = uVar32;
                      local_c0 = (PreparedDictionary *)(ulong)uVar12;
                    }
                  }
                }
              }
            }
            pPVar25 = (PreparedDictionary *)(ulong)uVar13;
            uVar14 = ~(uint)bVar22 * iVar15 + (uint)bVar3 + uVar14 * uVar13 + 1;
            pPVar27 = (PreparedDictionary *)&pPVar27->num_items;
          } while (pPVar27 <= pPVar21);
          *(uint *)&(params->dictionary).compound.total_size = uVar14;
        }
        (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar21->num_items;
      }
      if (local_100 < 0x7e5) {
        local_138 = (PreparedDictionary *)((long)&local_138->magic + 1);
        position = (long)&pPVar21->magic + 1;
        if (pPVar38 < position) {
          if ((PreparedDictionary *)((long)&pPVar38->magic + local_70) < position) {
            pPVar21 = (PreparedDictionary *)((long)&pPVar21->bucket_bits + 1);
            if (local_98 <= pPVar21) {
              pPVar21 = local_98;
            }
            for (; position < pPVar21;
                position = (size_t)&((PreparedDictionary *)position)->num_items) {
              *(uint *)(sVar6 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                        (position & ringbuffer_mask)
                                                                        ) * 0x7bd3579bd3000000) >>
                                                      0x30) + ((uint)position & 8) & 0xffff) * 4) =
                   (uint)position;
              local_138 = (PreparedDictionary *)&local_138->num_items;
              pPVar25 = local_138;
            }
          }
          else {
            pPVar21 = (PreparedDictionary *)((long)&pPVar21->source_size + 1);
            if (local_98 <= pPVar21) {
              pPVar21 = local_98;
            }
            for (; position < pPVar21; position = (long)&((PreparedDictionary *)position)->magic + 2
                ) {
              *(uint *)(sVar6 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                        (position & ringbuffer_mask)
                                                                        ) * 0x7bd3579bd3000000) >>
                                                      0x30) + ((uint)position & 8) & 0xffff) * 4) =
                   (uint)position;
              local_138 = (PreparedDictionary *)((long)&local_138->magic + 2);
              pPVar25 = local_138;
            }
          }
        }
      }
      else {
        local_78 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
        local_d0 = local_68 - (long)pPVar21;
        iVar15 = 0;
        do {
          local_130 = (PreparedDictionary *)((long)&local_130[-1].slot_bits + 3);
          pPVar38 = (PreparedDictionary *)((long)&local_38[-1].slot_bits + 3);
          if (local_130 <= pPVar38) {
            pPVar38 = local_130;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            pPVar38 = (PreparedDictionary *)0x0;
          }
          pPVar25 = (PreparedDictionary *)((long)&pPVar21->magic + 1);
          pPVar26 = pPVar34;
          if (pPVar25 < pPVar34) {
            pPVar26 = pPVar25;
          }
          puVar2 = (ulong *)(ringbuffer + ((ulong)pPVar25 & ringbuffer_mask));
          cVar30 = *(char *)((long)&pPVar38->magic + (long)puVar2);
          local_108 = 0x7e4;
          if (((PreparedDictionary *)((long)pPVar25 - (long)local_78) < pPVar25) &&
             (puVar16 = (ulong *)(ringbuffer +
                                 ((uint)(PreparedDictionary *)((long)pPVar25 - (long)local_78) &
                                 (uint)local_88)), pPVar37 = local_130, pPVar27 = local_130,
             puVar18 = puVar2, puVar28 = puVar16,
             cVar30 == *(char *)((long)&pPVar38->magic + (long)puVar16))) {
            for (; (PreparedDictionary *)0x7 < pPVar37;
                pPVar37 = (PreparedDictionary *)&pPVar37[-1].bucket_bits) {
              uVar32 = *puVar18;
              uVar17 = *puVar28;
              if (uVar32 == uVar17) {
                puVar28 = puVar28 + 1;
              }
              else {
                uVar7 = 0;
                if ((uVar17 ^ uVar32) != 0) {
                  for (; ((uVar17 ^ uVar32) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                pPVar27 = (PreparedDictionary *)
                          ((long)puVar28 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar16));
              }
              if (uVar32 != uVar17) goto LAB_01d4ce74;
              puVar18 = puVar18 + 1;
            }
            puVar31 = puVar28;
            if (pPVar37 != (PreparedDictionary *)0x0) {
              puVar31 = (ulong *)((long)puVar28 + (long)pPVar37);
              pPVar27 = (PreparedDictionary *)0x0;
              do {
                if (*(char *)((long)puVar28 + (long)pPVar27) !=
                    *(char *)((long)puVar18 + (long)pPVar27)) {
                  puVar31 = (ulong *)((long)puVar28 + (long)pPVar27);
                  break;
                }
                pPVar27 = (PreparedDictionary *)((long)&pPVar27->magic + 1);
              } while (pPVar37 != pPVar27);
            }
            pPVar27 = (PreparedDictionary *)((long)puVar31 - (long)puVar16);
LAB_01d4ce74:
            if ((pPVar27 < (PreparedDictionary *)0x4) ||
               (uVar32 = (long)pPVar27 * 0x87 + 0x78f, uVar32 < 0x7e5)) goto LAB_01d4ceb1;
            cVar30 = *(char *)((long)puVar2 + (long)pPVar27);
            pPVar38 = pPVar27;
            local_118 = local_78;
            local_108 = uVar32;
          }
          else {
LAB_01d4ceb1:
            local_118 = (PreparedDictionary *)0x0;
          }
          uVar11 = (uint)(ushort)((ulong)(*(long *)(ringbuffer + ((ulong)pPVar25 & ringbuffer_mask))
                                         * 0x7bd3579bd3000000) >> 0x30);
          local_a8[0] = (ulong)uVar11;
          local_a8[1] = (ulong)uVar11 + 8 & 0xffff;
          uVar11 = (uint)pPVar25;
          lVar24 = 0;
          do {
            uVar14 = *(uint *)(sVar6 + local_a8[lVar24] * 4);
            puVar18 = (ulong *)(ringbuffer + ((uint)local_88 & uVar14));
            if (((cVar30 == *(char *)((long)&pPVar38->magic + (long)puVar18)) &&
                (pPVar25 != (PreparedDictionary *)(ulong)uVar14)) &&
               (pPVar35 = (PreparedDictionary *)((long)pPVar25 - (long)(ulong)uVar14),
               pPVar37 = local_130, pPVar27 = local_130, puVar28 = puVar2, puVar16 = puVar18,
               pPVar35 <= pPVar26)) {
              for (; (PreparedDictionary *)0x7 < pPVar37;
                  pPVar37 = (PreparedDictionary *)&pPVar37[-1].bucket_bits) {
                uVar32 = *puVar28;
                uVar17 = *puVar16;
                if (uVar32 == uVar17) {
                  puVar16 = puVar16 + 1;
                }
                else {
                  uVar7 = 0;
                  if ((uVar17 ^ uVar32) != 0) {
                    for (; ((uVar17 ^ uVar32) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  pPVar27 = (PreparedDictionary *)
                            ((long)puVar16 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar18));
                }
                if (uVar32 != uVar17) goto LAB_01d4cfbe;
                puVar28 = puVar28 + 1;
              }
              puVar31 = puVar16;
              if (pPVar37 != (PreparedDictionary *)0x0) {
                puVar31 = (ulong *)((long)puVar16 + (long)pPVar37);
                pPVar27 = (PreparedDictionary *)0x0;
                do {
                  if (*(char *)((long)puVar16 + (long)pPVar27) !=
                      *(char *)((long)puVar28 + (long)pPVar27)) {
                    puVar31 = (ulong *)((long)puVar16 + (long)pPVar27);
                    break;
                  }
                  pPVar27 = (PreparedDictionary *)((long)&pPVar27->magic + 1);
                } while (pPVar37 != pPVar27);
              }
              pPVar27 = (PreparedDictionary *)((long)puVar31 - (long)puVar18);
LAB_01d4cfbe:
              if ((PreparedDictionary *)0x3 < pPVar27) {
                iVar33 = 0x1f;
                if ((uint)pPVar35 != 0) {
                  for (; (uint)pPVar35 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                  }
                }
                uVar32 = (ulong)(iVar33 * -0x1e + 0x780) + (long)pPVar27 * 0x87;
                if (local_108 < uVar32) {
                  cVar30 = *(char *)((long)puVar2 + (long)pPVar27);
                  pPVar38 = pPVar27;
                  local_118 = pPVar35;
                  local_108 = uVar32;
                }
              }
            }
            bVar39 = lVar24 == 0;
            lVar24 = lVar24 + 1;
          } while (bVar39);
          *(uint *)(sVar6 + *(long *)((long)local_a8 + (ulong)(uVar11 & 8)) * 4) = uVar11;
          if ((PreparedDictionary *)0x1f < local_130 && ((ulong)pPVar25 & 3) == 0) {
            pPVar37 = (params->dictionary).compound.chunks[1];
            if (pPVar37 <= pPVar25) {
              uVar14 = (uint)(params->dictionary).compound.total_size;
              iVar33 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
              iVar5 = *(int *)((params->dictionary).compound.chunks + 3);
              do {
                uVar13 = uVar14 & 0x3fffffff;
                bVar22 = ringbuffer[(ulong)pPVar37 & ringbuffer_mask];
                bVar3 = ringbuffer[(ulong)&pPVar37[1].source_size & ringbuffer_mask];
                if (uVar13 < 0x1000000) {
                  pPVar27 = (params->dictionary).compound.chunks[0];
                  uVar12 = (&pPVar27->magic)[uVar13];
                  (&pPVar27->magic)[uVar13] = (uint32_t)pPVar37;
                  if ((pPVar37 == pPVar25) && (uVar12 != 0xffffffff)) {
                    uVar13 = uVar11 - uVar12;
                    local_40 = (PreparedDictionary *)(ulong)uVar13;
                    if (local_40 <= pPVar26) {
                      puVar28 = (ulong *)(ringbuffer + (uVar12 & (uint)local_88));
                      lVar24 = 0;
                      lVar36 = 0;
                      puVar18 = puVar28;
                      do {
                        uVar32 = *(ulong *)((long)puVar2 + lVar36);
                        uVar17 = *puVar18;
                        if (uVar32 == uVar17) {
                          puVar18 = puVar18 + 1;
                        }
                        else {
                          uVar7 = 0;
                          if ((uVar17 ^ uVar32) != 0) {
                            for (; ((uVar17 ^ uVar32) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                            }
                          }
                          pPVar27 = (PreparedDictionary *)
                                    ((long)puVar18 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar28));
                        }
                        if (uVar32 != uVar17) goto LAB_01d4d190;
                        lVar36 = lVar36 + 8;
                        lVar19 = local_d0 + lVar24;
                        lVar24 = lVar24 + -8;
                      } while (7 < lVar19 - 8U);
                      if (lVar36 != local_d0) {
                        pcVar29 = (char *)((long)puVar2 + lVar36);
                        lVar24 = lVar24 + local_d0;
                        puVar31 = (ulong *)((long)puVar18 + (local_d0 - lVar36));
                        puVar16 = puVar18;
                        do {
                          puVar18 = puVar16;
                          if ((char)*puVar16 != *pcVar29) break;
                          pcVar29 = pcVar29 + 1;
                          puVar16 = (ulong *)((long)puVar16 + 1);
                          lVar24 = lVar24 + -1;
                          puVar18 = puVar31;
                        } while (lVar24 != 0);
                      }
                      pPVar27 = (PreparedDictionary *)((long)puVar18 - (long)puVar28);
LAB_01d4d190:
                      if (((PreparedDictionary *)0x3 < pPVar27) && (pPVar38 < pPVar27)) {
                        iVar9 = 0x1f;
                        if (uVar13 != 0) {
                          for (; uVar13 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                          }
                        }
                        uVar32 = (ulong)(iVar9 * -0x1e + 0x780) + (long)pPVar27 * 0x87;
                        if (local_108 < uVar32) {
                          pPVar38 = pPVar27;
                          local_118 = local_40;
                          local_108 = uVar32;
                        }
                      }
                    }
                  }
                }
                uVar14 = ~(uint)bVar22 * iVar5 + (uint)bVar3 + uVar14 * iVar33 + 1;
                pPVar37 = (PreparedDictionary *)&pPVar37->num_items;
              } while (pPVar37 <= pPVar25);
              *(uint *)&(params->dictionary).compound.total_size = uVar14;
            }
            (params->dictionary).compound.chunks[1] =
                 (PreparedDictionary *)((long)&pPVar21->num_items + 1);
          }
          if (local_108 < local_100 + 0xaf) {
            bVar39 = false;
            pPVar25 = pPVar21;
            pPVar38 = local_38;
            iVar33 = iVar15;
          }
          else {
            local_138 = (PreparedDictionary *)((long)&local_138->magic + 1);
            iVar33 = iVar15 + 1;
            bVar39 = iVar15 < 3 && (undefined1 *)((long)&pPVar21->source_size + 1) < local_90;
            local_100 = local_108;
            local_c0 = local_118;
          }
          local_d0 = local_d0 + -1;
          pPVar21 = pPVar25;
          local_38 = pPVar38;
          iVar15 = iVar33;
        } while (bVar39);
        pPVar21 = (PreparedDictionary *)((long)&pPVar25->magic + local_58);
        if (pPVar34 <= pPVar21) {
          pPVar21 = pPVar34;
        }
        pPVar21 = (PreparedDictionary *)((long)&pPVar21->magic + local_60);
        if (pPVar21 < local_c0) {
LAB_01d4d3db:
          puVar20 = (undefined1 *)((long)&local_c0->hash_bits + 3);
        }
        else {
          pPVar26 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
          uVar11 = 0;
          bVar39 = false;
          if (local_c0 != pPVar26) {
            pPVar37 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
            if (local_c0 == pPVar37) {
              uVar11 = 1;
            }
            else {
              pcVar29 = (char *)((long)local_c0 + (3 - (long)pPVar26));
              if (pcVar29 < (char *)0x7) {
                bVar22 = (byte)((int)pcVar29 << 2);
                uVar11 = 0x9750468;
              }
              else {
                pcVar29 = (char *)((long)local_c0 + (3 - (long)pPVar37));
                if ((char *)0x6 < pcVar29) {
                  if (local_c0 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1))
                  {
                    bVar39 = local_c0 !=
                             (PreparedDictionary *)
                             (long)*(int *)((long)(hasher->common).extra + 0xc);
                    uVar11 = 3;
                    goto LAB_01d4d3d7;
                  }
                  uVar11 = 2;
                  goto LAB_01d4d3d5;
                }
                bVar22 = (byte)((int)pcVar29 << 2);
                uVar11 = 0xfdb1ace;
              }
              uVar11 = uVar11 >> (bVar22 & 0x1f) & 0xf;
            }
LAB_01d4d3d5:
            bVar39 = false;
          }
LAB_01d4d3d7:
          if (bVar39) goto LAB_01d4d3db;
          puVar20 = (undefined1 *)(ulong)uVar11;
        }
        if ((local_c0 <= pPVar21) && (puVar20 != (undefined1 *)0x0)) {
          *(undefined4 *)((long)(hasher->common).extra + 0xc) =
               *(undefined4 *)((hasher->common).extra + 1);
          *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
          *(int *)(hasher->common).extra = (int)local_c0;
        }
        *(int *)local_c8 = (int)local_138;
        iVar15 = (int)pPVar38;
        *(int *)((long)local_c8 + 4) = iVar15;
        puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
        if (puVar20 < puVar1) {
          *(short *)((long)local_c8 + 0xe) = (short)puVar20;
          iVar33 = 0;
        }
        else {
          bVar22 = (byte)*(int *)(literal_context_lut + 0x38);
          puVar20 = puVar20 + ((4L << (bVar22 & 0x3f)) -
                              (ulong)*(uint *)(literal_context_lut + 0x3c)) + -0x10;
          uVar11 = 0x1f;
          if ((uint)puVar20 != 0) {
            for (; (uint)puVar20 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          uVar11 = (uVar11 ^ 0xffffffe0) + 0x1f;
          bVar39 = ((ulong)puVar20 >> ((ulong)uVar11 & 0x3f) & 1) != 0;
          iVar33 = uVar11 - *(int *)(literal_context_lut + 0x38);
          *(ushort *)((long)local_c8 + 0xe) =
               (short)((uint)bVar39 + iVar33 * 2 + 0xfffe << (bVar22 & 0x3f)) +
               (short)puVar1 + (~(ushort)(-1 << (bVar22 & 0x1f)) & (ushort)puVar20) |
               (short)iVar33 * 0x400;
          iVar33 = (int)((long)puVar20 - ((ulong)bVar39 + 2 << ((byte)uVar11 & 0x3f)) >>
                        (bVar22 & 0x3f));
        }
        *(int *)(local_c8 + 1) = iVar33;
        pPVar21 = local_138;
        if ((PreparedDictionary *)0x5 < local_138) {
          if (local_138 < (PreparedDictionary *)0x82) {
            puVar20 = (undefined1 *)((long)&local_138[-1].slot_bits + 2);
            uVar11 = 0x1f;
            uVar14 = (uint)puVar20;
            if (uVar14 != 0) {
              for (; uVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            pPVar21 = (PreparedDictionary *)
                      (ulong)((int)((ulong)puVar20 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f))
                              + (uVar11 ^ 0xffffffe0) * 2 + 0x40);
          }
          else if (local_138 < (PreparedDictionary *)0x842) {
            uVar14 = (int)local_138 - 0x42;
            uVar11 = 0x1f;
            if (uVar14 != 0) {
              for (; uVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            pPVar21 = (PreparedDictionary *)(ulong)((uVar11 ^ 0xffe0) + 0x2a);
          }
          else {
            pPVar21 = (PreparedDictionary *)0x15;
            if ((PreparedDictionary *)0x1841 < local_138) {
              pPVar21 = (PreparedDictionary *)
                        (ulong)(ushort)(0x17 - (local_138 < (PreparedDictionary *)0x5842));
            }
          }
        }
        uVar32 = (ulong)iVar15;
        if (uVar32 < 10) {
          uVar11 = iVar15 - 2;
        }
        else if (uVar32 < 0x86) {
          uVar11 = 0x1f;
          uVar14 = (uint)(uVar32 - 6);
          if (uVar14 != 0) {
            for (; uVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          uVar11 = (int)(uVar32 - 6 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar11 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar11 = 0x17;
          if (uVar32 < 0x846) {
            uVar11 = 0x1f;
            if (iVar15 - 0x46U != 0) {
              for (; iVar15 - 0x46U >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
          }
        }
        uVar10 = (ushort)uVar11;
        sVar23 = (uVar10 & 7) + ((ushort)pPVar21 & 7) * 8;
        if ((((*(ushort *)((long)local_c8 + 0xe) & 0x3ff) == 0) && ((ushort)pPVar21 < 8)) &&
           (uVar10 < 0x10)) {
          if (7 < uVar10) {
            sVar23 = sVar23 + 0x40;
          }
        }
        else {
          iVar15 = (int)(((ulong)pPVar21 & 0xffff) >> 3) * 3 + ((uVar11 & 0xffff) >> 3);
          sVar23 = sVar23 + ((ushort)(0x520d40 >> ((char)iVar15 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar15 * 0x40 + 0x40;
        }
        *(short *)((long)local_c8 + 0xc) = sVar23;
        *num_commands = (size_t)((long)&local_138->magic + *num_commands);
        position = (long)&pPVar38->magic + (long)&pPVar25->magic;
        pPVar21 = local_48;
        if (position < local_48) {
          pPVar21 = (PreparedDictionary *)position;
        }
        pPVar26 = (PreparedDictionary *)((long)&pPVar25->magic + 2);
        if (local_c0 < (PreparedDictionary *)((ulong)pPVar38 >> 2)) {
          pPVar37 = (PreparedDictionary *)(position + (long)local_c0 * -4);
          if (pPVar37 < pPVar26) {
            pPVar37 = pPVar26;
          }
          pPVar26 = pPVar37;
          if (pPVar21 < pPVar37) {
            pPVar26 = pPVar21;
          }
        }
        pPVar38 = (PreparedDictionary *)
                  ((long)&pPVar25->magic + (long)((long)&local_50->magic + (long)pPVar38 * 2));
        local_c8 = local_c8 + 2;
        pPVar25 = local_50;
        if (pPVar26 < pPVar21) {
          do {
            pPVar25 = (PreparedDictionary *)
                      (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                              ((ulong)pPVar26 & ringbuffer_mask)) *
                                                    0x7bd3579bd3000000) >> 0x30) +
                              ((uint)pPVar26 & 8) & 0xffff);
            *(uint *)(sVar6 + (long)pPVar25 * 4) = (uint)pPVar26;
            pPVar26 = (PreparedDictionary *)((long)&pPVar26->magic + 1);
          } while (pPVar21 != pPVar26);
        }
        local_138 = (PreparedDictionary *)0x0;
      }
      puVar20 = local_90;
      pPVar21 = (PreparedDictionary *)position;
    } while (&((PreparedDictionary *)position)->source_size < local_90);
  }
  else {
    local_c8 = last_insert_len;
  }
  *(undefined1 **)dist_cache = local_90 + ((long)&local_138->magic - position);
  *(long *)commands = *(long *)commands + ((long)local_c8 - (long)last_insert_len >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}